

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O1

void __thiscall
rigtorp::SPSCQueue<unsigned_long,_std::allocator<unsigned_long>_>::~SPSCQueue
          (SPSCQueue<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  __int_type_conflict _Var1;
  __int_type_conflict _Var2;
  unsigned_long *puVar3;
  
  do {
    _Var1 = (this->readIdx_).super___atomic_base<unsigned_long>._M_i;
    if (_Var1 == this->writeIdxCache_) {
      _Var2 = (this->writeIdx_).super___atomic_base<unsigned_long>._M_i;
      this->writeIdxCache_ = _Var2;
      if (_Var2 == _Var1) {
LAB_00103527:
        operator_delete(this->slots_,this->capacity_ * 8 + 0x80);
        return;
      }
      puVar3 = this->slots_;
    }
    else {
      puVar3 = this->slots_;
    }
    if (puVar3 + _Var1 == (unsigned_long *)0xffffffffffffffc0) goto LAB_00103527;
    pop(this);
  } while( true );
}

Assistant:

~SPSCQueue() {
    while (front()) {
      pop();
    }
    std::allocator_traits<Allocator>::deallocate(allocator_, slots_,
                                                 capacity_ + 2 * kPadding);
  }